

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_string_format.cpp
# Opt level: O2

int ON_String::FormatVargsOutputCount(char *format,__va_list_tag *args)

{
  int iVar1;
  va_list args_copy;
  undefined8 local_18;
  void *pvStack_10;
  void *local_8;
  
  iVar1 = 0;
  if ((format != (char *)0x0) && (iVar1 = 0, *format != '\0')) {
    local_8 = args->reg_save_area;
    local_18._0_4_ = args->gp_offset;
    local_18._4_4_ = args->fp_offset;
    pvStack_10 = args->overflow_arg_area;
    iVar1 = vsnprintf((char *)0x0,0,format,&local_18);
  }
  return iVar1;
}

Assistant:

int ON_String::FormatVargsOutputCount(
  const char* format,
  va_list args
  )
{
  if ( nullptr == format || 0 == format[0] )
    return 0;

#if defined(ON_COMPILER_CLANG) || defined(ON_COMPILER_GNU)
  // CLang modifies args so a copy is required
  va_list args_copy;
  va_copy (args_copy, args);

#if defined(ON_RUNTIME_ANDROID) || defined(ON_RUNTIME_LINUX) || defined(ON_RUNTIME_WASM)
  int len = vsnprintf(nullptr, 0, format, args_copy);
#else
  int len = vsnprintf_l(nullptr, 0, ON_Locale::Ordinal.NumericLocalePtr(), format, args_copy);
#endif
  va_end(args_copy);
  return len;
#else
  return _vscprintf_p_l(format, ON_Locale::Ordinal.NumericLocalePtr(), args);
#endif
}